

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expertInline.hpp
# Opt level: O0

Scal __thiscall LinearExpert<1,_1>::queryX(LinearExpert<1,_1> *this,X *x)

{
  MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *this_00;
  TransposeReturnType this_01;
  MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *in_RDI;
  Scalar __x;
  double dVar1;
  ReturnType RVar2;
  double dVar3;
  X dx;
  MatrixBase<Eigen::Product<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_0>_>
  *in_stack_fffffffffffffe78;
  DiagonalBase<Eigen::DiagonalWrapper<const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
  *in_stack_fffffffffffffe80;
  undefined1 in_stack_fffffffffffffe98 [16];
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
  *this_02;
  MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *in_stack_fffffffffffffea8;
  StorageBaseType *in_stack_fffffffffffffec0;
  Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_0>
  *in_stack_fffffffffffffec8;
  
  this_02 = in_stack_fffffffffffffe98._8_8_;
  if (((byte)in_RDI[0xa0] & 1) != 0) {
    Eigen::MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>::asDiagonal
              ((MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)in_stack_fffffffffffffe78);
    Eigen::DiagonalBase<Eigen::DiagonalWrapper<Eigen::Matrix<double,1,1,0,1,1>const>>::operator*
              (in_stack_fffffffffffffe80,
               (MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)in_stack_fffffffffffffe78);
    Eigen::Matrix<double,1,1,0,1,1>::operator=
              ((Matrix<double,_1,_1,_0,_1,_1> *)in_stack_fffffffffffffe80,
               (DenseBase<Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_1>_>
                *)in_stack_fffffffffffffe78);
    Eigen::DenseBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>::transpose
              ((DenseBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)in_stack_fffffffffffffe78);
    Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,1,1,0,1,1>>>::operator*
              ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_> *)
               in_stack_fffffffffffffe80,
               (MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)in_stack_fffffffffffffe78);
    Eigen::Matrix<double,1,1,0,1,1>::operator=
              ((Matrix<double,_1,_1,_0,_1,_1> *)in_stack_fffffffffffffe80,
               (DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_0>_>
                *)in_stack_fffffffffffffe78);
    Eigen::MatrixBase<Eigen::Matrix<double,1,1,0,1,1>>::operator+
              (in_stack_fffffffffffffea8,in_stack_fffffffffffffe98._8_8_);
    Eigen::Matrix<double,1,1,0,1,1>::operator=
              ((Matrix<double,_1,_1,_0,_1,_1> *)in_stack_fffffffffffffe80,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                *)in_stack_fffffffffffffe78);
    Eigen::MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>::inverse
              ((MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)in_stack_fffffffffffffe78);
    Eigen::Matrix<double,1,1,0,1,1>::operator=
              ((Matrix<double,_1,_1,_0,_1,_1> *)in_stack_fffffffffffffe80,
               (DenseBase<Eigen::Inverse<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_> *)
               in_stack_fffffffffffffe78);
    Eigen::DenseBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>::operator-
              (in_stack_fffffffffffffe98._0_8_);
    Eigen::
    MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,1,1,0,1,1>const>>
    ::operator*(in_stack_fffffffffffffe98._0_8_,in_RDI);
    Eigen::DenseBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>::transpose
              ((DenseBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)in_stack_fffffffffffffe78);
    Eigen::operator*(in_stack_fffffffffffffec8,(StorageBaseType *)in_stack_fffffffffffffec0);
    Eigen::Matrix<double,1,1,0,1,1>::operator=
              ((Matrix<double,_1,_1,_0,_1,_1> *)in_stack_fffffffffffffe80,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_1,_1,_1,_1>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>_>
                *)in_stack_fffffffffffffe78);
    Eigen::MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>::asDiagonal
              ((MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)in_stack_fffffffffffffe78);
    this_02 = in_stack_fffffffffffffe98._8_8_;
    Eigen::DenseBase<Eigen::Matrix<double,1,1,0,1,1>>::operator+=
              ((DenseBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)this_02,
               in_stack_fffffffffffffe98._0_8_);
    __x = Eigen::MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>::determinant
                    ((MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)0x285d42);
    dVar1 = sqrt(__x);
    *(double *)(in_RDI + 0x180) = dVar1;
    in_RDI[0xa0] = (MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>)0x0;
  }
  Eigen::MatrixBase<Eigen::Matrix<double,1,1,0,1,1>>::operator-
            (in_stack_fffffffffffffea8,(MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)this_02)
  ;
  Eigen::Matrix<double,1,1,0,1,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,1,1,0,1,1>const,Eigen::Matrix<double,1,1,0,1,1>const>>
            ((Matrix<double,_1,_1,_0,_1,_1> *)in_stack_fffffffffffffe80,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
              *)in_stack_fffffffffffffe78);
  this_00 = in_RDI + 0x120;
  this_01 = Eigen::DenseBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>::transpose
                      ((DenseBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)in_stack_fffffffffffffe78
                      );
  Eigen::MatrixBase<Eigen::Matrix<double,1,1,0,1,1>>::operator*
            (this_00,(MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_> *)
                     in_stack_fffffffffffffe78);
  Eigen::operator*((Product<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::Transpose<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_0>
                    *)in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  Eigen::MatrixBase<Eigen::Matrix<double,1,1,0,1,1>>::operator+
            ((MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)this_01.m_matrix,this_02);
  Eigen::Matrix<double,1,1,0,1,1>::operator=
            ((Matrix<double,_1,_1,_0,_1,_1> *)this_00,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>_>
              *)in_stack_fffffffffffffe78);
  dVar1 = *(double *)(in_RDI + 0x180);
  Eigen::MatrixBase<Eigen::Matrix<double,1,1,0,1,1>>::operator*
            (this_00,(MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)in_stack_fffffffffffffe78)
  ;
  RVar2 = Eigen::MatrixBase<Eigen::Matrix<double,1,1,0,1,1>>::
          dot<Eigen::Product<Eigen::Matrix<double,1,1,0,1,1>,Eigen::Matrix<double,1,1,0,1,1>,0>>
                    (this_00,in_stack_fffffffffffffe78);
  dVar3 = exp(RVar2 * -0.5);
  *(double *)(in_RDI + 0xb8) = dVar1 * dVar3;
  return *(Scal *)(in_RDI + 0xb8);
}

Assistant:

EXPERT_CLASS_TEMPLATE
Scal LINEAR_EXPERT_base::queryX( X const &x )
{
    if( recompute )
    {
        PsiLambda = invPsi.asDiagonal() * Lambda;
        LambdaPsiLambda = Lambda.transpose() * PsiLambda;

        // Observation Variance
        pred_z_invVar = invSigma + LambdaPsiLambda;
        pred_z_var = pred_z_invVar.inverse();                      //TODO: Optimize this!

        p_x_invVar = - PsiLambda * pred_z_var * PsiLambda.transpose();
        p_x_invVar += invPsi.asDiagonal();
        p_x_invVarSqrtDet = sqrt(p_x_invVar.determinant());        //TODO: Optimize this!

        // Prediction Variance
//        pred_z_var_factor = pred_z_var * LambdaPsiLambda * pred_z_var;
//        if( wNu == 0.0 )
//            pred_z_var *= 1.0/Sh;
//        else
//        {
//            Z dz = Nu - Sz/Sh;
//            pred_z_var *= 1.0/Sh + dz.dot( varLambda * dz );
//        }

        recompute = false;
    }

    X dx = x - Mu;

    pred_z = Nu + pred_z_var * PsiLambda.transpose() * dx;
    p_x_Norm = p_x_invVarSqrtDet * exp( -0.5 * dx.dot(p_x_invVar * dx) );

    return p_x_Norm;
}